

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::add_neighbor_features(search_private *priv,multi_ex *ec_seq)

{
  uint uVar1;
  vw *pvVar2;
  float *pfVar3;
  char cVar4;
  pointer ppeVar5;
  int *piVar6;
  ostream *poVar7;
  char cVar8;
  ulong uVar9;
  uint uVar10;
  float *pfVar11;
  long lVar12;
  ulong uVar13;
  uint32_t *puVar14;
  uint64_t uVar15;
  example *peVar16;
  long *plVar17;
  int iVar18;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  ostream *local_58;
  example *local_50;
  uint64_t local_48;
  string *local_40;
  uint64_t local_38;
  
  if (((priv->neighbor_features)._end != (priv->neighbor_features)._begin) &&
     (ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start,
     (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
     super__Vector_impl_data._M_finish != ppeVar5)) {
    pvVar2 = priv->all;
    puVar14 = &(pvVar2->weights).dense_weights._stride_shift;
    if ((pvVar2->weights).sparse != false) {
      puVar14 = &(pvVar2->weights).sparse_weights._stride_shift;
    }
    local_40 = (string *)&priv->field_0x370;
    local_48 = 0x3a5d15L << ((byte)*puVar14 & 0x3f);
    local_38 = 0x372faf1dL << ((byte)*puVar14 & 0x3f);
    local_58 = (ostream *)&priv->field_0x368;
    uVar9 = 0;
    do {
      piVar6 = (priv->neighbor_features)._begin;
      peVar16 = ppeVar5[uVar9];
      if ((priv->neighbor_features)._end != piVar6) {
        uVar13 = 0;
        local_50 = ppeVar5[uVar9];
        do {
          uVar1 = piVar6[uVar13];
          iVar18 = (int)uVar1 >> 0x18;
          uVar10 = uVar1 & 0xff;
          priv->dat_new_feature_ec = local_50;
          priv->dat_new_feature_value = 1.0;
          priv->dat_new_feature_idx = (long)piVar6[uVar13] * 0xd1c79f;
          priv->dat_new_feature_namespace = 0x83;
          if (priv->all->audit == true) {
            priv->dat_new_feature_feature_space = (string *)neighbor_feature_space_abi_cxx11_;
            local_78[0] = local_68;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
            std::__cxx11::stringbuf::str(local_40);
            if (local_78[0] != local_68) {
              operator_delete(local_78[0]);
            }
            local_78[0]._0_1_ = (string)0x40;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(local_58,(char *)local_78,1)
            ;
            local_78[0]._0_1_ = (string)((iVar18 < 1) * '\x02' + '+');
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_78,1);
            cVar4 = (char)(uVar1 >> 0x18);
            cVar8 = -cVar4;
            if (0 < iVar18) {
              cVar8 = cVar4;
            }
            local_78[0] = (undefined1 *)CONCAT71(local_78[0]._1_7_,cVar8 + '0');
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_78,1);
            if (uVar10 != 0x20) {
              local_78[0] = (undefined1 *)CONCAT71(local_78[0]._1_7_,(char)uVar1);
              std::__ostream_insert<char,std::char_traits<char>>(local_58,(char *)local_78,1);
            }
          }
          uVar15 = local_38;
          if (iVar18 < 0 && uVar9 < (uint)-iVar18) {
LAB_00255624:
            add_new_feature(priv,1.0,uVar15);
          }
          else {
            ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            uVar15 = local_48;
            if ((ulong)((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar5 >> 3) <=
                (long)iVar18 + uVar9) goto LAB_00255624;
            peVar16 = ppeVar5[(long)iVar18 + uVar9];
            pfVar11 = *(float **)((peVar16->super_example_predict).feature_space + uVar10);
            pfVar3 = *(float **)
                      ((long)((peVar16->super_example_predict).feature_space + uVar10) + 8);
            if (pfVar11 != pfVar3) {
              uVar15 = (local_50->super_example_predict).ft_offset;
              plVar17 = *(long **)((long)((peVar16->super_example_predict).feature_space + uVar10) +
                                  0x20);
              do {
                add_new_feature(priv,*pfVar11,*plVar17 + uVar15);
                pfVar11 = pfVar11 + 1;
                plVar17 = plVar17 + 1;
              } while (pfVar11 != pfVar3);
            }
          }
          uVar13 = uVar13 + 1;
          piVar6 = (priv->neighbor_features)._begin;
          peVar16 = local_50;
        } while (uVar13 < (ulong)((long)(priv->neighbor_features)._end - (long)piVar6 >> 2));
      }
      lVar12 = (long)(peVar16->super_example_predict).feature_space[0x83].values._end -
               (long)(peVar16->super_example_predict).feature_space[0x83].values._begin;
      if ((lVar12 == 0) || ((peVar16->super_example_predict).feature_space[0x83].sum_feat_sq <= 0.0)
         ) {
        features::clear((peVar16->super_example_predict).feature_space + 0x83);
      }
      else {
        v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar16,&neighbor_namespace);
        peVar16->total_sum_feat_sq =
             (peVar16->super_example_predict).feature_space[0x83].sum_feat_sq +
             peVar16->total_sum_feat_sq;
        peVar16->num_features = peVar16->num_features + (lVar12 >> 2);
      }
      uVar9 = uVar9 + 1;
      ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(ec_seq->
                                   super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar5 >> 3));
  }
  return;
}

Assistant:

void add_neighbor_features(search_private& priv, multi_ex& ec_seq)
{
  if (priv.neighbor_features.size() == 0)
    return;

  uint32_t stride_shift = priv.all->weights.stride_shift();
  for (size_t n = 0; n < ec_seq.size(); n++)  // iterate over every example in the sequence
  {
    example& me = *ec_seq[n];
    for (size_t n_id = 0; n_id < priv.neighbor_features.size(); n_id++)
    {
      int32_t offset = priv.neighbor_features[n_id] >> 24;
      size_t ns = priv.neighbor_features[n_id] & 0xFF;

      priv.dat_new_feature_ec = &me;
      priv.dat_new_feature_value = 1.;
      priv.dat_new_feature_idx = priv.neighbor_features[n_id] * 13748127;
      priv.dat_new_feature_namespace = neighbor_namespace;
      if (priv.all->audit)
      {
        priv.dat_new_feature_feature_space = &neighbor_feature_space;
        priv.dat_new_feature_audit_ss.str("");
        priv.dat_new_feature_audit_ss << '@' << ((offset > 0) ? '+' : '-') << (char)(abs(offset) + '0');
        if (ns != ' ')
          priv.dat_new_feature_audit_ss << (char)ns;
      }

      // cerr << "n=" << n << " offset=" << offset << endl;
      if ((offset < 0) && (n < (uint64_t)(-offset)))  // add <s> feature
        add_new_feature(priv, 1., (uint64_t)925871901 << stride_shift);
      else if (n + offset >= ec_seq.size())  // add </s> feature
        add_new_feature(priv, 1., (uint64_t)3824917 << stride_shift);
      else  // this is actually a neighbor
      {
        example& other = *ec_seq[n + offset];
        GD::foreach_feature<search_private, add_new_feature>(priv.all, other.feature_space[ns], priv, me.ft_offset);
      }
    }

    features& fs = me.feature_space[neighbor_namespace];
    size_t sz = fs.size();
    if ((sz > 0) && (fs.sum_feat_sq > 0.))
    {
      me.indices.push_back(neighbor_namespace);
      me.total_sum_feat_sq += fs.sum_feat_sq;
      me.num_features += sz;
    }
    else
      fs.clear();
  }
}